

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeKRMmatricesGlobal
          (ChElementShellANCF_3833 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor
          )

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  PointerType pdVar11;
  double dVar12;
  double dVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar24 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar25 [64];
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict2 ScaledMassMatrix;
  long local_a10;
  long local_a08;
  long local_a00;
  double adStack_9c0 [4];
  double adStack_9a0 [302];
  
  auVar25._8_56_ = in_register_00001248;
  auVar25._0_8_ = Rfactor;
  auVar24._8_56_ = in_register_00001208;
  auVar24._0_8_ = Kfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value != 0x48) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 0x48)) {
    __assert_fail("(H.rows() == 3 * NSF) && (H.cols() == 3 * NSF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellANCF_3833.cpp"
                  ,0x1f5,
                  "virtual void chrono::fea::ChElementShellANCF_3833::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  if (this->m_method == ContInt) {
    auVar22._8_8_ = 0x8000000000000000;
    auVar22._0_8_ = 0x8000000000000000;
    auVar22 = vxorpd_avx512vl(auVar24._0_16_,auVar22);
    if (this->m_damping_enabled == true) {
      auVar23._8_8_ = 0x8000000000000000;
      auVar23._0_8_ = 0x8000000000000000;
      auVar23 = vxorpd_avx512vl(auVar25._0_16_,auVar23);
      ComputeInternalJacobianContIntDamping(this,H,auVar22._0_8_,auVar23._0_8_);
    }
    else {
      ComputeInternalJacobianContIntNoDamping(this,H,auVar22._0_8_);
    }
  }
  else {
    ComputeInternalJacobianPreInt(this,H,Kfactor,Rfactor);
  }
  uVar15 = 0xfffffffffffffffc;
  do {
    pdVar4 = (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
             m_storage.m_data.array + uVar15 + 4;
    dVar7 = pdVar4[1];
    dVar12 = pdVar4[2];
    dVar13 = pdVar4[3];
    adStack_9a0[uVar15] = Mfactor * *pdVar4;
    adStack_9a0[uVar15 + 1] = Mfactor * dVar7;
    adStack_9a0[uVar15 + 2] = Mfactor * dVar12;
    adStack_9a0[uVar15 + 3] = Mfactor * dVar13;
    uVar15 = uVar15 + 4;
  } while (uVar15 < 0x128);
  lVar16 = 0x18;
  local_a00 = 0;
  lVar19 = 0;
  uVar15 = 0;
  local_a10 = 0x10;
  local_a08 = 8;
  lVar18 = 0;
  do {
    uVar2 = lVar18 * 3 + 1;
    uVar3 = lVar18 * 3 + 2;
    uVar21 = uVar15 & 0xffffffff;
    uVar15 = lVar16 + uVar21;
    uVar17 = 300;
    if (300 < uVar21) {
      uVar17 = uVar21;
    }
    lVar20 = 0;
    do {
      if (uVar17 == uVar21) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 300, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 300, 1>, Level = 1]"
                     );
      }
      uVar8 = (H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value;
      if ((long)uVar8 <= lVar18 * 3) {
LAB_007495c8:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                     );
      }
      uVar9 = (H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value;
      uVar1 = lVar19 + lVar20;
      if ((long)uVar9 <= (long)uVar1) goto LAB_007495c8;
      lVar10 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value;
      pdVar11 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data;
      dVar7 = adStack_9c0[uVar21];
      lVar14 = local_a00 * lVar10 + local_a00;
      *(double *)((long)pdVar11 + lVar20 * 8 + lVar14) =
           dVar7 + *(double *)((long)pdVar11 + lVar20 * 8 + lVar14);
      if ((((uVar8 <= uVar2) || (uVar5 = lVar19 + 1 + lVar20, uVar9 <= uVar5)) ||
          (lVar14 = local_a08 * lVar10 + local_a00,
          *(double *)((long)pdVar11 + lVar20 * 8 + lVar14 + 8) =
               dVar7 + *(double *)((long)pdVar11 + lVar20 * 8 + lVar14 + 8), uVar8 <= uVar3)) ||
         (uVar6 = lVar19 + 2 + lVar20, uVar9 <= uVar6)) goto LAB_007495c8;
      lVar14 = local_a10 * lVar10 + local_a00;
      *(double *)((long)pdVar11 + lVar20 * 8 + lVar14 + 0x10) =
           dVar7 + *(double *)((long)pdVar11 + lVar20 * 8 + lVar14 + 0x10);
      if (lVar20 != 0) {
        if (((uVar8 <= uVar1) || (uVar9 <= (ulong)(lVar18 * 3))) ||
           ((pdVar11[lVar18 * 3 + uVar1 * lVar10] = dVar7 + pdVar11[lVar18 * 3 + uVar1 * lVar10],
            uVar8 <= uVar5 || (uVar9 <= uVar2)))) goto LAB_007495c8;
        pdVar11[uVar2 + uVar5 * lVar10] = dVar7 + pdVar11[uVar2 + uVar5 * lVar10];
        if ((uVar8 <= uVar6) || (uVar9 <= uVar3)) goto LAB_007495c8;
        pdVar11[uVar3 + lVar10 * uVar6] = dVar7 + pdVar11[uVar3 + lVar10 * uVar6];
      }
      uVar21 = uVar21 + 1;
      lVar10 = lVar19 + 3 + lVar20;
      lVar20 = lVar20 + 3;
    } while (lVar10 != 0x48);
    local_a10 = local_a10 + 0x18;
    local_a00 = local_a00 + 0x18;
    local_a08 = local_a08 + 0x18;
    lVar18 = lVar18 + 1;
    lVar16 = lVar16 + -1;
    lVar19 = lVar19 + 3;
    if (lVar18 == 0x18) {
      return;
    }
  } while( true );
}

Assistant:

void ChElementShellANCF_3833::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 3 * NSF) && (H.cols() == 3 * NSF));

    if (m_method == IntFrcMethod::ContInt) {
        if (m_damping_enabled) {  // If linear Kelvin-Voigt viscoelastic material model is enabled
            ComputeInternalJacobianContIntDamping(H, -Kfactor, -Rfactor);
        } else {
            ComputeInternalJacobianContIntNoDamping(H, -Kfactor);
        }
    } else {
        ComputeInternalJacobianPreInt(H, Kfactor, Rfactor);
    }

    // Add in the Mass Matrix Which is Stored in Compact Upper Triangular Form
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            H(3 * i, 3 * j) += ScaledMassMatrix(idx);
            H(3 * i + 1, 3 * j + 1) += ScaledMassMatrix(idx);
            H(3 * i + 2, 3 * j + 2) += ScaledMassMatrix(idx);
            if (i != j) {
                H(3 * j, 3 * i) += ScaledMassMatrix(idx);
                H(3 * j + 1, 3 * i + 1) += ScaledMassMatrix(idx);
                H(3 * j + 2, 3 * i + 2) += ScaledMassMatrix(idx);
            }
            idx++;
        }
    }
}